

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_writer_init_heap
                  (mz_zip_archive *pZip,size_t size_to_reserve_at_beginning,
                  size_t initial_allocation_size)

{
  mz_bool mVar1;
  long lVar2;
  mz_zip_archive *in_RDX;
  mz_zip_archive *in_RSI;
  long in_RDI;
  mz_zip_archive *in_stack_ffffffffffffffd8;
  mz_zip_archive *pmVar3;
  mz_bool local_4;
  
  *(code **)(in_RDI + 0x48) = tinyexr::miniz::mz_zip_heap_write_func;
  *(long *)(in_RDI + 0x50) = in_RDI;
  mVar1 = mz_zip_writer_init(in_stack_ffffffffffffffd8,0x150fa0);
  if (mVar1 == 0) {
    local_4 = 0;
  }
  else {
    pmVar3 = in_RSI;
    if (in_RSI < in_RDX) {
      pmVar3 = in_RDX;
    }
    if (pmVar3 != (mz_zip_archive *)0x0) {
      lVar2 = (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x38),1,pmVar3);
      *(long *)(*(long *)(in_RDI + 0x58) + 0x68) = lVar2;
      if (lVar2 == 0) {
        mz_zip_writer_end(in_RSI);
        return 0;
      }
      *(mz_zip_archive **)(*(long *)(in_RDI + 0x58) + 0x78) = pmVar3;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_writer_init_heap(mz_zip_archive *pZip,
                                size_t size_to_reserve_at_beginning,
                                size_t initial_allocation_size) {
  pZip->m_pWrite = mz_zip_heap_write_func;
  pZip->m_pIO_opaque = pZip;
  if (!mz_zip_writer_init(pZip, size_to_reserve_at_beginning)) return MZ_FALSE;
  if (0 != (initial_allocation_size = MZ_MAX(initial_allocation_size,
                                             size_to_reserve_at_beginning))) {
    if (NULL == (pZip->m_pState->m_pMem = pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, initial_allocation_size))) {
      mz_zip_writer_end(pZip);
      return MZ_FALSE;
    }
    pZip->m_pState->m_mem_capacity = initial_allocation_size;
  }
  return MZ_TRUE;
}